

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O3

void __thiscall QSocks5BindStore::timerEvent(QSocks5BindStore *this,QTimerEvent *event)

{
  char cVar1;
  Data<QHashPrivate::Node<long_long,_QSocks5BindData_*>_> *pDVar2;
  size_t sVar3;
  ulong uVar4;
  QDeadlineTimer QVar5;
  piter it;
  
  QVar5.t2 = 0xffffffff;
  QVar5.type = 0x7fffffff;
  QVar5.t1 = (qint64)&this->mutex;
  QRecursiveMutex::tryLock(QVar5);
  if (*(TimerId *)(event + 0x10) != (this->sweepTimer).m_id) goto LAB_00237644;
  pDVar2 = (this->store).d;
  if (pDVar2 == (Data<QHashPrivate::Node<long_long,_QSocks5BindData_*>_> *)0x0) {
    pDVar2 = (Data<QHashPrivate::Node<long_long,_QSocks5BindData_*>_> *)0x0;
    sVar3 = 0;
LAB_00237597:
    it.bucket = sVar3;
    it.d = pDVar2;
    if (pDVar2 == (Data<QHashPrivate::Node<long_long,_QSocks5BindData_*>_> *)0x0 && sVar3 == 0)
    goto LAB_00237644;
  }
  else {
    if (1 < (uint)(pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      pDVar2 = QHashPrivate::Data<QHashPrivate::Node<long_long,_QSocks5BindData_*>_>::detached
                         (pDVar2);
      (this->store).d = pDVar2;
    }
    if (pDVar2->spans->offsets[0] == 0xff) {
      uVar4 = 1;
      do {
        sVar3 = uVar4;
        if (pDVar2->numBuckets == sVar3) {
          pDVar2 = (Data<QHashPrivate::Node<long_long,_QSocks5BindData_*>_> *)0x0;
          sVar3 = 0;
          break;
        }
        uVar4 = sVar3 + 1;
      } while (pDVar2->spans[sVar3 >> 7].offsets[(uint)sVar3 & 0x7f] == 0xff);
      goto LAB_00237597;
    }
    it.bucket = 0;
    it.d = pDVar2;
  }
  do {
    uVar4 = it.bucket;
    pDVar2 = it.d;
    cVar1 = QElapsedTimer::hasExpired
                      (*(long *)(pDVar2->spans[uVar4 >> 7].entries
                                 [pDVar2->spans[uVar4 >> 7].offsets[(uint)it.bucket & 0x7f]].storage
                                 .data + 8) + 0x30);
    if (cVar1 == '\0') {
      do {
        if (pDVar2->numBuckets - 1 == uVar4) {
          it = (piter)ZEXT816(0);
          break;
        }
        uVar4 = uVar4 + 1;
        it.bucket = uVar4;
        it.d = pDVar2;
      } while (pDVar2->spans[uVar4 >> 7].offsets[(uint)uVar4 & 0x7f] == 0xff);
    }
    else {
      it = (piter)QHash<long_long,_QSocks5BindData_*>::erase(&this->store,(const_iterator)it);
    }
  } while ((it.d != (Data<QHashPrivate::Node<long_long,_QSocks5BindData_*>_> *)0x0) ||
          (it.bucket != 0));
LAB_00237644:
  QRecursiveMutex::unlock();
  return;
}

Assistant:

void QSocks5BindStore::timerEvent(QTimerEvent * event)
{
    QMutexLocker lock(&mutex);
    if (event->id() == sweepTimer.id()) {
        QSOCKS5_DEBUG << "QSocks5BindStore performing sweep";
        for (auto it = store.begin(), end = store.end(); it != end;) {
            if (it.value()->timeStamp.hasExpired(350000)) {
                QSOCKS5_DEBUG << "QSocks5BindStore removing JJJJ";
                it = store.erase(it);
            } else {
                ++it;
            }
        }
    }
}